

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

ref_entry * cram_ref_load(refs_t *r,int id)

{
  ref_entry *e;
  ref_entry *prVar1;
  long lVar2;
  int64_t iVar3;
  int iVar4;
  BGZF *fp;
  char *pcVar5;
  char *mode;
  
  e = r->ref_id[id];
  if (e->seq != (char *)0x0) {
    return e;
  }
  if (e->count != 0) {
    __assert_fail("e->count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                  ,0x898,"ref_entry *cram_ref_load(refs_t *, int)");
  }
  iVar3 = e->length;
  prVar1 = r->last;
  if (prVar1 != (ref_entry *)0x0) {
    lVar2 = prVar1->count;
    if (lVar2 < 1) {
      __assert_fail("r->last->count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                    ,0x8a2,"ref_entry *cram_ref_load(refs_t *, int)");
    }
    prVar1->count = lVar2 + -1;
    if ((lVar2 == 1) && (prVar1->seq != (char *)0x0)) {
      free(prVar1->seq);
      r->last->seq = (char *)0x0;
    }
  }
  pcVar5 = e->fn;
  mode = pcVar5;
  iVar4 = strcmp(r->fn,pcVar5);
  fp = r->fp;
  if (iVar4 == 0) {
    if (fp != (BGZF *)0x0) goto LAB_0012d67c;
  }
  else if (fp != (BGZF *)0x0) {
    iVar4 = bgzf_close(fp);
    if (iVar4 != 0) {
      return (ref_entry *)0x0;
    }
    pcVar5 = e->fn;
  }
  r->fn = pcVar5;
  fp = bgzf_open_ref(pcVar5,mode);
  r->fp = fp;
  if (fp == (BGZF *)0x0) {
    return (ref_entry *)0x0;
  }
LAB_0012d67c:
  pcVar5 = load_ref_portion(fp,e,1,(int)iVar3);
  if (pcVar5 == (char *)0x0) {
    return (ref_entry *)0x0;
  }
  e->seq = pcVar5;
  lVar2 = e->count;
  r->last = e;
  e->count = lVar2 + 2;
  return e;
}

Assistant:

ref_entry *cram_ref_load(refs_t *r, int id) {
    ref_entry *e = r->ref_id[id];
    int start = 1, end = e->length;
    char *seq;

    if (e->seq) {
	return e;
    }

    assert(e->count == 0);

    if (r->last) {
#ifdef REF_DEBUG
	int idx = 0;
	for (idx = 0; idx < r->nref; idx++)
	    if (r->last == r->ref_id[idx])
		break;
	RP("%d cram_ref_load DECR %d\n", gettid(), idx);
#endif
	assert(r->last->count > 0);
	if (--r->last->count <= 0) {
	    RP("%d FREE REF %d (%p)\n", gettid(), id, r->ref_id[id]->seq);
	    if (r->last->seq) {
		free(r->last->seq);
		r->last->seq = NULL;
	    }
	}
    }

    /* Open file if it's not already the current open reference */
    if (strcmp(r->fn, e->fn) || r->fp == NULL) {
	if (r->fp)
	    if (bgzf_close(r->fp) != 0)
		return NULL;
	r->fn = e->fn;
	if (!(r->fp = bgzf_open_ref(r->fn, "r")))
	    return NULL;
    }

    RP("%d Loading ref %d (%d..%d)\n", gettid(), id, start, end);

    if (!(seq = load_ref_portion(r->fp, e, start, end))) {
	return NULL;
    }

    RP("%d Loaded ref %d (%d..%d) = %p\n", gettid(), id, start, end, seq);

    RP("%d INC REF %d, %d\n", gettid(), id, (int)(e->count+1));
    e->seq = seq;
    e->count++;

    /*
     * Also keep track of last used ref so incr/decr loops on the same
     * sequence don't cause load/free loops.
     */
    RP("%d cram_ref_load INCR %d => %d\n", gettid(), id, e->count+1);
    r->last = e;
    e->count++; 

    return e;
}